

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall
QDialogButtonBoxPrivate::removeButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,RemoveReason reason)

{
  long lVar1;
  long in_FS_OFFSET;
  QWidget *local_58;
  code *local_50;
  undefined8 local_48;
  QWidget *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &button->super_QWidget;
  if (button != (QAbstractButton *)0x0) {
    QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
    ::remove(&this->hiddenButtons,(char *)&local_58);
    lVar1 = 0;
    do {
      QtPrivate::sequential_erase_one<QList<QAbstractButton*>,QAbstractButton*>
                ((QList<QAbstractButton_*> *)((long)&this->buttonLists[0].d.d + lVar1),
                 (QAbstractButton **)&local_58);
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0xd8);
    if (reason == ManualRemove) {
      QWidget::setParent(local_58,(QWidget *)0x0);
      local_40 = (QWidget *)QAbstractButton::clicked;
      local_38 = 0;
      local_50 = handleButtonClicked;
      local_48 = 0;
      QObject::disconnectImpl
                (&local_58->super_QObject,&local_40,
                 *(QObject **)&(this->super_QWidgetPrivate).field_0x8,&local_50,
                 &QAbstractButton::staticMetaObject);
      local_40 = (QWidget *)QObject::destroyed;
      local_38 = 0;
      local_50 = handleButtonDestroyed;
      local_48 = 0;
      QObject::disconnectImpl
                (&local_58->super_QObject,&local_40,
                 *(QObject **)&(this->super_QWidgetPrivate).field_0x8,&local_50,
                 (QMetaObject *)&QObject::staticMetaObject);
      QObject::removeEventFilter(&local_58->super_QObject);
    }
    else if (reason != Destroyed) goto LAB_0046f231;
    local_40 = local_58;
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::remove(&this->standardButtonMap,(char *)&local_40);
  }
LAB_0046f231:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::removeButton(QAbstractButton *button, RemoveReason reason)
{
    if (!button)
        return;

    // Remove button from hidden buttons and roles
    hiddenButtons.remove(button);
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i)
        buttonLists[i].removeOne(button);

    switch (reason) {
    case RemoveReason::ManualRemove:
        button->setParent(nullptr);
        QObjectPrivate::disconnect(button, &QAbstractButton::clicked,
                                   this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::disconnect(button, &QAbstractButton::destroyed,
                                   this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->removeEventFilter(filter.get());
        Q_FALLTHROUGH();
    case RemoveReason::Destroyed:
        standardButtonMap.remove(reinterpret_cast<QPushButton *>(button));
        break;
    case RemoveReason::HideEvent:
        break;
    }
}